

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,string *val)

{
  complex<double> val_00;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  NamedPoint *__str;
  int in_EDX;
  char *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  NamedPoint *point;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  NamedPoint *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ::index(in_RDI,in_RSI,in_EDX);
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a12d8);
    CLI::std::__cxx11::to_string(in_stack_ffffffffffffff08);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(this);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::
    get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a131d);
    CLI::std::__cxx11::to_string((long)in_stack_ffffffffffffff48);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(this);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a1363);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_fffffffffffffef8);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a1385);
    val_00._M_value._8_8_ = in_stack_ffffffffffffff18;
    val_00._M_value._0_8_ = in_stack_ffffffffffffff10;
    helicsComplexString_abi_cxx11_(val_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(this);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::
    get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a13ef);
    helicsVectorString_abi_cxx11_
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(this);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a142a);
    helicsComplexVectorString_abi_cxx11_
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_ffffffffffffff50);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(this);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    __str = std::
            get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                      ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x3a1465);
    uVar1 = std::isnan(__str->value);
    if ((uVar1 & 1) == 0) {
      helicsNamedPointString_abi_cxx11_(in_stack_ffffffffffffff18);
    }
    else {
      std::__cxx11::string::string(in_stack_ffffffffffffff40,&__str->name);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(this);
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::string& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::to_string(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val = std::to_string(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        default:
            val = std::get<std::string>(data);
            break;
        case complex_loc:  // complex
            val = helicsComplexString(std::get<std::complex<double>>(data));
            break;
        case vector_loc:  // vector
            val = helicsVectorString(std::get<std::vector<double>>(data));
            break;
        case complex_vector_loc:  // vector
            val = helicsComplexVectorString(std::get<std::vector<std::complex<double>>>(data));
            break;
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            val = (std::isnan(point.value)) ? point.name : helicsNamedPointString(point);
            break;
        }
    }
}